

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::MergePartialFromCodedStream
          (GeneratedCodeInfo_Annotation *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  UnknownFieldSet *unknown_fields;
  char cVar6;
  uint tag;
  ulong uVar7;
  string *value;
  
  this_00 = &this->source_file_;
LAB_001ff263:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ff286;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ff286:
      uVar5 = io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if ((uVar7 & 0x100000000) == 0) goto switchD_001ff2f6_default;
    cVar6 = (char)uVar7;
    switch((uint)(uVar7 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar6 == '\b') {
        bVar4 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,10,input,&this->path_);
      }
      else {
        if ((tag & 0xff) != 10) break;
        bVar4 = internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->path_);
      }
      goto LAB_001ff2da;
    case 2:
      if (cVar6 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        value = (this->source_file_).ptr_;
        if (value == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          value = this_00->ptr_;
        }
        bVar4 = internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar4) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
        goto LAB_001ff263;
      }
      break;
    case 3:
      if (cVar6 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar7 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001ff405;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_001ff405:
          uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar7 < 0) {
            return false;
          }
        }
        this->begin_ = (int32)uVar7;
        goto LAB_001ff263;
      }
      break;
    case 4:
      if (cVar6 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar7 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001ff41f;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_001ff41f:
          uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar7 < 0) {
            return false;
          }
        }
        this->end_ = (int32)uVar7;
        goto LAB_001ff263;
      }
    }
switchD_001ff2f6_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar3 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      unknown_fields =
           internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar4 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_001ff2da:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool GeneratedCodeInfo_Annotation::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.GeneratedCodeInfo.Annotation)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10u, input, this->mutable_path())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string source_file = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source_file().data(), this->source_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 begin = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_begin();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &begin_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 end = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_end();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &end_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.GeneratedCodeInfo.Annotation)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.GeneratedCodeInfo.Annotation)
  return false;
#undef DO_
}